

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::BitmapImage::BitmapImage(BitmapImage *this,FILE *f,size_t width,size_t height)

{
  BitmapImage(this,width,height);
  freadx(f,this->data,this->row_bytes * this->height);
  return;
}

Assistant:

BitmapImage::BitmapImage(FILE* f, size_t width, size_t height)
    : BitmapImage(width, height) {
  freadx(f, this->data, this->get_data_size());
}